

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.hpp
# Opt level: O1

SquareMatrix<double,_3> * __thiscall
OpenMD::Quaternion<double>::toRotationMatrix3
          (SquareMatrix<double,_3> *__return_storage_ptr__,Quaternion<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint i;
  long lVar4;
  double tmp;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][0] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][1] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][1] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][2] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][2] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][0] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][0] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][1] = 0.0;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][2] = 0.0;
  dVar5 = 0.0;
  lVar4 = 0;
  do {
    dVar1 = (this->super_Vector<double,_4U>).data_[lVar4];
    dVar5 = dVar5 + dVar1 * dVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (1e-06 <= ABS(dVar5 + -1.0)) {
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      dVar1 = (this->super_Vector<double,_4U>).data_[lVar4];
      dVar5 = dVar5 + dVar1 * dVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    lVar4 = 0;
    do {
      auVar6._8_8_ = dVar5;
      auVar6._0_8_ = dVar5;
      auVar6 = divpd(*(undefined1 (*) [16])((this->super_Vector<double,_4U>).data_ + lVar4),auVar6);
      *(undefined1 (*) [16])((this->super_Vector<double,_4U>).data_ + lVar4) = auVar6;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 4);
  }
  dVar5 = (this->super_Vector<double,_4U>).data_[0];
  dVar1 = (this->super_Vector<double,_4U>).data_[3];
  dVar2 = (this->super_Vector<double,_4U>).data_[1];
  dVar3 = (this->super_Vector<double,_4U>).data_[2];
  dVar11 = dVar1 * dVar1;
  dVar7 = dVar3 * dVar3;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][0] =
       ((dVar5 * dVar5 + dVar2 * dVar2) - dVar7) - dVar11;
  dVar9 = dVar2 * dVar3 + dVar5 * dVar1;
  dVar10 = dVar1 * dVar2 + -dVar5 * dVar3;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][1] = dVar9 + dVar9;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[0][2] = dVar10 + dVar10;
  dVar9 = dVar2 * dVar3 - dVar1 * dVar5;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][0] = dVar9 + dVar9;
  dVar8 = dVar5 * dVar5 - dVar2 * dVar2;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][1] = (dVar8 + dVar7) - dVar11;
  dVar9 = dVar1 * dVar3 + dVar5 * dVar2;
  dVar10 = dVar1 * dVar2 + dVar5 * dVar3;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[1][2] = dVar9 + dVar9;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][0] = dVar10 + dVar10;
  dVar5 = dVar3 * dVar1 - dVar2 * dVar5;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][1] = dVar5 + dVar5;
  (__return_storage_ptr__->super_RectMatrix<double,_3U,_3U>).data_[2][2] = (dVar8 - dVar7) + dVar11;
  return __return_storage_ptr__;
}

Assistant:

SquareMatrix<Real, 3> toRotationMatrix3() {
      SquareMatrix<Real, 3> rotMat3;

      Real w2;
      Real x2;
      Real y2;
      Real z2;

      if (!this->isNormalized()) this->normalize();

      w2 = w() * w();
      x2 = x() * x();
      y2 = y() * y();
      z2 = z() * z();

      rotMat3(0, 0) = w2 + x2 - y2 - z2;
      rotMat3(0, 1) = 2.0 * (x() * y() + w() * z());
      rotMat3(0, 2) = 2.0 * (x() * z() - w() * y());

      rotMat3(1, 0) = 2.0 * (x() * y() - w() * z());
      rotMat3(1, 1) = w2 - x2 + y2 - z2;
      rotMat3(1, 2) = 2.0 * (y() * z() + w() * x());

      rotMat3(2, 0) = 2.0 * (x() * z() + w() * y());
      rotMat3(2, 1) = 2.0 * (y() * z() - w() * x());
      rotMat3(2, 2) = w2 - x2 - y2 + z2;

      return rotMat3;
    }